

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void * drawnumber_new(t_symbol *classsym,int argc,t_atom *argv)

{
  uint argc_00;
  char *pcVar1;
  t_pd *pp_Var2;
  _glist *p_Var3;
  t_symbol *ptVar4;
  t_pd p_Var5;
  int argc_01;
  
  pp_Var2 = pd_new(drawnumber_class);
  *(undefined2 *)(pp_Var2 + 0x16) = 1;
  *(undefined4 *)(pp_Var2 + 0x17) = 0x3f800000;
  pp_Var2[0x18] = (t_pd)0x0;
  pp_Var2[0x19] = (t_pd)0x0;
  *(undefined4 *)(pp_Var2 + 0x1a) = 0;
  p_Var3 = canvas_getcurrent();
  pp_Var2[0x1c] = (t_pd)p_Var3;
  argc_01 = argc + -4;
  while( true ) {
    argc_00 = argc_01 + 4;
    ptVar4 = atom_getsymbolarg(0,argc_00,argv);
    pcVar1 = ptVar4->s_name;
    if ((((*pcVar1 != '-') || (pcVar1[1] != 'v')) || ((int)argc_00 < 2)) || (pcVar1[2] != '\0'))
    break;
    fielddesc_setfloatarg((_fielddesc *)(pp_Var2 + 0x16),1,argv + 1);
    argv = argv + 2;
    argc_01 = argc_01 + -2;
  }
  p_Var5 = (t_pd)atom_getsymbolarg(0,argc_00,argv);
  pp_Var2[6] = p_Var5;
  if (argc_00 < 2) {
    *(undefined2 *)(pp_Var2 + 7) = 1;
    *(undefined4 *)(pp_Var2 + 8) = 0;
    pp_Var2[9] = (t_pd)0x0;
    pp_Var2[10] = (t_pd)0x0;
    *(undefined4 *)(pp_Var2 + 0xb) = 0;
LAB_00158119:
    *(undefined2 *)(pp_Var2 + 0xc) = 1;
    *(undefined4 *)(pp_Var2 + 0xd) = 0;
    pp_Var2[0xe] = (t_pd)0x0;
    pp_Var2[0xf] = (t_pd)0x0;
    *(undefined4 *)(pp_Var2 + 0x10) = 0;
LAB_00158131:
    *(undefined2 *)(pp_Var2 + 0x11) = 1;
    *(undefined4 *)(pp_Var2 + 0x12) = 0x3f800000;
    pp_Var2[0x13] = (t_pd)0x0;
    pp_Var2[0x14] = (t_pd)0x0;
    *(undefined4 *)(pp_Var2 + 0x15) = 0;
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(pp_Var2 + 7),argc_01 + 3,argv + 1);
    if (argc_01 == -2) goto LAB_00158119;
    fielddesc_setfloatarg((_fielddesc *)(pp_Var2 + 0xc),argc_01 + 2,argv + 2);
    if (argc_01 + 1 == 0) goto LAB_00158131;
    fielddesc_setfloatarg((_fielddesc *)(pp_Var2 + 0x11),argc_01 + 1,argv + 3);
    if (argc_01 != 0) {
      ptVar4 = atom_getsymbolarg(0,argc_01,argv + 4);
      goto LAB_0015815c;
    }
  }
  ptVar4 = &s_;
LAB_0015815c:
  pp_Var2[0x1b] = (t_pd)ptVar4;
  return pp_Var2;
}

Assistant:

static void *drawnumber_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_drawnumber *x = (t_drawnumber *)pd_new(drawnumber_class);
    const char *classname = classsym->s_name;

    fielddesc_setfloat_const(&x->x_vis, 1);
    x->x_canvas = canvas_getcurrent();
    while (1)
    {
        t_symbol *firstarg = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(firstarg->s_name, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else break;
    }
        /* next argument is name of field to draw - we don't know its type yet
        but fielddesc_setfloatarg() will do fine here. */
    x->x_fieldname = atom_getsymbolarg(0, argc, argv);
    if (argc)
        argc--, argv++;
    if (argc) fielddesc_setfloatarg(&x->x_xloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xloc, 0);
    if (argc) fielddesc_setfloatarg(&x->x_yloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_yloc, 0);
    if (argc) fielddesc_setfloatarg(&x->x_color, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_color, 1);
    if (argc)
        x->x_label = atom_getsymbolarg(0, argc, argv);
    else x->x_label = &s_;

    return (x);
}